

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::IsValidVertex(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  ON_BrepVertex *pOVar4;
  ON_BrepEdge *pOVar5;
  int *piVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *format;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  uVar9 = (ulong)(uint)vertex_index;
  if (vertex_index < 0 ||
      (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count <=
      vertex_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",uVar9)
      ;
    }
  }
  else {
    pOVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if (pOVar4[uVar9].m_vertex_index == vertex_index) {
      uVar3 = pOVar4[uVar9].m_ei.m_count;
      pOVar5 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      uVar13 = 0;
      uVar8 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar8 = uVar13;
      }
      for (; uVar13 != uVar8; uVar13 = uVar13 + 1) {
        piVar6 = pOVar4[uVar9].m_ei.m_a;
        uVar3 = piVar6[uVar13];
        lVar12 = (long)(int)uVar3;
        if ((lVar12 < 0) ||
           ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count
            <= (int)uVar3)) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_00416d96;
          ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index
                           );
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"vertex.m_ei[%d] = %d (should be >=0 and <%d).\n",
                            uVar13 & 0xffffffff,(ulong)uVar3,
                            (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                         super_ON_ClassArray<ON_BrepEdge>.m_count);
          goto LAB_00416d91;
        }
        if (uVar3 != pOVar5[lVar12].m_edge_index) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_00416d96;
          ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
          ON_TextLog::PushIndent(text_log);
          format = "vertex.m_ei[%d] = %d is a deleted edge.\n";
          uVar13 = uVar13 & 0xffffffff;
          uVar9 = (ulong)uVar3;
          goto LAB_00416d87;
        }
        uVar11 = 1;
        for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
          if (piVar6[uVar10] == uVar3) {
            if ((pOVar5[lVar12].m_vi[0] == vertex_index) && (pOVar5[lVar12].m_vi[1] == vertex_index)
               ) goto LAB_00416cc6;
            if (text_log == (ON_TextLog *)0x0) goto LAB_00416d96;
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d"
                              ,uVar10 & 0xffffffff,uVar13 & 0xffffffff,(ulong)uVar3,(ulong)uVar3,
                              (ulong)(uint)pOVar5[lVar12].m_vi[0]);
            ON_TextLog::Print(text_log,
                              "and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n"
                              ,(ulong)uVar3,(ulong)(uint)pOVar5[lVar12].m_vi[1],
                              (ulong)(uint)vertex_index);
            goto LAB_00416d91;
          }
          uVar11 = uVar11 + 1;
        }
        if ((pOVar5[lVar12].m_vi[0] != vertex_index) && (pOVar5[lVar12].m_vi[1] != vertex_index)) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_00416d96;
          ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index
                           );
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,
                            "vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. At least one edge m_vi[] value should be %d.\n"
                            ,uVar13 & 0xffffffff,(ulong)uVar3,(ulong)uVar3,
                            (ulong)(uint)pOVar5[lVar12].m_vi[0],(ulong)(uint)pOVar5[lVar12].m_vi[1],
                            uVar9);
          goto LAB_00416d91;
        }
LAB_00416cad:
      }
      if (0.0 < pOVar4[uVar9].m_tolerance || pOVar4[uVar9].m_tolerance == 0.0) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_00416d96;
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_tolerace = %g (should be >= 0.0)\n",
                        pOVar4[uVar9].m_tolerance);
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_00416d96;
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      uVar13 = (ulong)(uint)pOVar4[uVar9].m_vertex_index;
      format = "vertex.m_vertex_index = %d (should be %d).\n";
LAB_00416d87:
      ON_TextLog::Print(text_log,format,uVar13,uVar9);
    }
LAB_00416d91:
    ON_TextLog::PopIndent(text_log);
  }
LAB_00416d96:
  bVar7 = ON_IsNotValid();
  return bVar7;
LAB_00416cc6:
  if (uVar13 <= uVar11) goto LAB_00416cad;
  uVar1 = uVar11 + 1;
  puVar2 = (uint *)(piVar6 + uVar11);
  uVar11 = uVar1;
  if (*puVar2 == uVar3) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00416d96;
    ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n"
                      ,uVar10 & 0xffffffff,uVar13 & 0xffffffff,(ulong)((int)uVar1 - 1),(ulong)uVar3)
    ;
    ON_TextLog::Print(text_log,"in vertex.m_ei[] and a closed edge index should appear twice.\n");
    goto LAB_00416d91;
  }
  goto LAB_00416cc6;
}

Assistant:

bool
ON_Brep::IsValidVertex( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return ON_BrepIsNotValid();
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  const int vertex_edge_count = vertex.m_ei.Count();
  int i, j, vei, ei;
  for ( vei = 0; vei < vertex_edge_count; vei++ ) {
    ei = vertex.m_ei[vei];
    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d (should be >=0 and <%d).\n", vei, ei, m_E.Count());
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepEdge& edge = m_E[ei];
    if ( ei != edge.m_edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d is a deleted edge.\n", vei, ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    for ( i = 0; i < vei; i++ ) 
    {
      if ( vertex.m_ei[i] == ei ) 
      {
        // edge should be closed
        if ( edge.m_vi[0] != vertex_index || edge.m_vi[1] != vertex_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
            text_log->PushIndent();
            text_log->Print("vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d",
                             i,vei,ei,ei,edge.m_vi[0]);
            text_log->Print("and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n",
                            ei,edge.m_vi[1],vertex_index);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }
        for (j = i+1; j < vei; j++ ) 
        {
          if ( vertex.m_ei[j] == ei )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
              text_log->PushIndent();
              text_log->Print("vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n",i,vei,j,ei);
              text_log->Print("in vertex.m_ei[] and a closed edge index should appear twice.\n");
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
        break;
      }
    }
    if ( edge.m_vi[0] != vertex_index && edge.m_vi[1] != vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. "
                        "At least one edge m_vi[] value should be %d.\n",
                        vei,ei,ei,edge.m_vi[0],edge.m_vi[1],vertex_index);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
  }

  if ( vertex.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_tolerace = %g (should be >= 0.0)\n",vertex.m_tolerance);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  return true;
}